

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.c
# Opt level: O3

void reset_mem_pool(mem_pool **root,size_t target_used_mem)

{
  mem_pool *pmVar1;
  ulong uVar2;
  ulong uVar3;
  mem_pool *pmVar4;
  mem_pool *pmVar5;
  
  pmVar5 = *root;
  pmVar1 = pmVar5->prev;
  if (pmVar1 != (mem_pool *)0x0) {
    uVar3 = pmVar5->size;
    pmVar4 = pmVar1;
    do {
      uVar3 = uVar3 + pmVar4->size;
      pmVar4 = pmVar4->prev;
    } while (pmVar4 != (mem_pool *)0x0);
    pmVar4 = pmVar5;
    if (target_used_mem < uVar3) {
      while( true ) {
        pmVar5 = pmVar1;
        uVar2 = pmVar4->size;
        if (uVar2 < uVar3 - target_used_mem) break;
        pmVar4->size = 0;
        if ((pmVar5->prev == (mem_pool *)0x0) ||
           (uVar3 = uVar3 - uVar2, pmVar4 = pmVar5, pmVar1 = pmVar5->prev, uVar3 <= target_used_mem)
           ) goto LAB_0010a8ac;
      }
      pmVar4->size = uVar2 - (uVar3 - target_used_mem);
      pmVar5 = pmVar4;
    }
  }
LAB_0010a8ac:
  *root = pmVar5;
  return;
}

Assistant:

void reset_mem_pool(struct mem_pool** root, size_t target_used_mem) {
    struct mem_pool* cur = *root;
    size_t used_mem = get_used_mem(cur);
    while (cur->prev && used_mem > target_used_mem) {
        if (used_mem - target_used_mem > cur->size) {
            cur->size -= used_mem - target_used_mem;
            break;
        } else {
            used_mem -= cur->size;
            cur->size = 0;
            cur = cur->prev;
        }
    }
    *root = cur;
}